

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metatype_generic.cpp
# Opt level: O1

generic * mpt::metatype::generic::create(type_t type,void *ptr,type_traits *traits)

{
  size_t __n;
  int iVar1;
  generic *this;
  int *piVar2;
  generic *__s;
  
  __n = traits->size;
  if (__n == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    this = (generic *)malloc(__n + 0x28);
    if (this != (generic *)0x0) {
      __s = this + 1;
      if (traits->init == (_func_int_void_ptr_void_ptr *)0x0) {
        if (ptr == (void *)0x0) {
          memset(__s,0,__n);
        }
        else {
          memcpy(__s,ptr,__n);
        }
      }
      else {
        iVar1 = (*traits->init)(__s,ptr);
        if (iVar1 < 0) {
          free(this);
          return (generic *)0x0;
        }
      }
      generic(this);
      this->_traits = traits;
      this->_val = __s;
      this->_type = type;
      return this;
    }
  }
  return (generic *)0x0;
}

Assistant:

metatype::generic *metatype::generic::create(type_t type, const void *ptr, const type_traits &traits)
{
	if (!traits.size) {
		errno = EINVAL;
		return 0;
	}
	metatype::generic *mt;
	void *data = malloc(sizeof(*mt) + traits.size);
	if (!data) {
		return 0;
	}
	void *val = static_cast<metatype::generic *>(data) + 1;
	if (!traits.init) {
		if (ptr) {
			memcpy(val, ptr, traits.size);
		}
		else {
			memset(val, 0, traits.size);
		}
	}
	else if (traits.init(val, ptr) < 0) {
		free(data);
		return 0;
	}
	
	mt = new (data) metatype::generic();
	mt->_traits = &traits;
	mt->_val = val;
	mt->_type = type;
	
	return mt;
}